

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
cubeb_resampler_speex
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
           *this,cubeb_resampler_speex_one_way<short> *input_processor,
          delay_line<short> *output_processor,cubeb_stream *s,cubeb_data_callback cb,void *ptr)

{
  code *pcVar1;
  code *pcVar2;
  
  (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00143158;
  (this->input_processor)._M_t.
  super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl =
       input_processor;
  (this->output_processor)._M_t.
  super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
  super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
  super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl = output_processor;
  this->stream = s;
  this->data_callback = cb;
  this->user_ptr = ptr;
  this->draining = false;
  if (input_processor != (cubeb_resampler_speex_one_way<short> *)0x0 ||
      output_processor != (delay_line<short> *)0x0) {
    pcVar1 = fill_internal_duplex;
    if (output_processor == (delay_line<short> *)0x0) {
      pcVar1 = fill_internal_input;
    }
    if (input_processor == (cubeb_resampler_speex_one_way<short> *)0x0) {
      pcVar1 = fill_internal_input;
    }
    pcVar2 = fill_internal_output;
    if (input_processor != (cubeb_resampler_speex_one_way<short> *)0x0) {
      pcVar2 = pcVar1;
    }
    this->fill_internal = (processing_callback)pcVar2;
    *(undefined8 *)&this->field_0x20 = 0;
  }
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::
    cubeb_resampler_speex(InputProcessor * input_processor,
                          OutputProcessor * output_processor, cubeb_stream * s,
                          cubeb_data_callback cb, void * ptr)
    : input_processor(input_processor), output_processor(output_processor),
      stream(s), data_callback(cb), user_ptr(ptr)
{
  if (input_processor && output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_duplex;
  } else if (input_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_input;
  } else if (output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_output;
  }
}